

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpkeyhashtable.h
# Opt level: O2

bool __thiscall jrtplib::RTPSources::GotoFirstSourceWithData(RTPSources *this)

{
  HashElement *pHVar1;
  RTPInternalSourceData *pRVar2;
  bool bVar3;
  HashElement **ppHVar4;
  
  ppHVar4 = &(this->sourcelist).firsthashelem;
  bVar3 = false;
  do {
    pHVar1 = *ppHVar4;
    (this->sourcelist).curhashelem = pHVar1;
    do {
      if ((bVar3 != false) || (pHVar1 == (HashElement *)0x0)) {
        return bVar3;
      }
      pRVar2 = pHVar1->element;
      bVar3 = (bool)((pRVar2->super_RTPSourceData).packetlist.
                     super__List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>.
                     _M_impl._M_node.super__List_node_base._M_next !=
                     (_List_node_base *)&(pRVar2->super_RTPSourceData).packetlist &
                    (pRVar2->super_RTPSourceData).validated);
    } while (bVar3 != false);
    ppHVar4 = &pHVar1->listnext;
  } while( true );
}

Assistant:

void GotoFirstElement()					{ curhashelem = firsthashelem; }